

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4ShadedPalCommand::Execute
          (DrawColumnRt4ShadedPalCommand *this,DrawerThread *thread)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int local_40;
  uint32_t val;
  int count;
  int pitch;
  uint8_t *dest;
  uint8_t *source;
  uint8_t *colormap;
  uint32_t *fgstart;
  DrawerThread *thread_local;
  DrawColumnRt4ShadedPalCommand *this_local;
  
  local_40 = DrawerThread::count_for_thread
                       (thread,(this->super_PalRtCommand).yl,
                        ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < local_40) {
    iVar1 = (this->super_PalRtCommand)._color;
    puVar2 = (this->super_PalRtCommand)._colormap;
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _count = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar5 + iVar4) * 4) + (this->super_PalRtCommand).sx);
    puVar3 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar3 + (iVar5 << 2);
    iVar5 = (this->super_PalRtCommand)._pitch;
    iVar4 = thread->num_cores;
    do {
      uVar6 = Col2RGB8[0x40 - puVar2[*dest]][*_count] + Col2RGB8[puVar2[*dest]][iVar1] | 0x1f07c1f;
      *_count = RGB32k.All[uVar6 & uVar6 >> 0xf];
      uVar6 = Col2RGB8[0x40 - puVar2[dest[1]]][_count[1]] + Col2RGB8[puVar2[dest[1]]][iVar1] |
              0x1f07c1f;
      _count[1] = RGB32k.All[uVar6 & uVar6 >> 0xf];
      uVar6 = Col2RGB8[0x40 - puVar2[dest[2]]][_count[2]] + Col2RGB8[puVar2[dest[2]]][iVar1] |
              0x1f07c1f;
      _count[2] = RGB32k.All[uVar6 & uVar6 >> 0xf];
      uVar6 = Col2RGB8[0x40 - puVar2[dest[3]]][_count[3]] + Col2RGB8[puVar2[dest[3]]][iVar1] |
              0x1f07c1f;
      _count[3] = RGB32k.All[uVar6 & uVar6 >> 0xf];
      dest = dest + 4;
      _count = _count + iVar5 * iVar4;
      local_40 = local_40 + -1;
    } while (local_40 != 0);
  }
  return;
}

Assistant:

void DrawColumnRt4ShadedPalCommand::Execute(DrawerThread *thread)
	{
		uint32_t *fgstart;
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		fgstart = &Col2RGB8[0][_color];
		colormap = _colormap;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;

		do {
			uint32_t val;
		
			val = colormap[source[0]];
			val = (Col2RGB8[64-val][dest[0]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[0] = RGB32k.All[val & (val>>15)];

			val = colormap[source[1]];
			val = (Col2RGB8[64-val][dest[1]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[1] = RGB32k.All[val & (val>>15)];

			val = colormap[source[2]];
			val = (Col2RGB8[64-val][dest[2]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[2] = RGB32k.All[val & (val>>15)];

			val = colormap[source[3]];
			val = (Col2RGB8[64-val][dest[3]] + fgstart[val<<8]) | 0x1f07c1f;
			dest[3] = RGB32k.All[val & (val>>15)];

			source += 4;
			dest += pitch;
		} while (--count);
	}